

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::SSLServer::process_and_close_socket(SSLServer *this,socket_t sock)

{
  bool bVar1;
  socket_t sock_local;
  SSLServer *this_local;
  
  bVar1 = detail::
          process_and_close_socket_ssl<int(*)(ssl_st*),httplib::SSLServer::process_and_close_socket(int)::_lambda(ssl_st*)_1_,httplib::SSLServer::process_and_close_socket(int)::_lambda(ssl_st*,httplib::Stream&,bool,bool&)_1_>
                    (0,sock,(this->super_Server).keep_alive_max_count_,
                     (this->super_Server).read_timeout_sec_,(this->super_Server).read_timeout_usec_,
                     this->ctx_,&this->ctx_mutex_,SSL_accept,this);
  return bVar1;
}

Assistant:

inline bool SSLServer::process_and_close_socket(socket_t sock) {
  return detail::process_and_close_socket_ssl(
      false, sock, keep_alive_max_count_, read_timeout_sec_, read_timeout_usec_,
      ctx_, ctx_mutex_, SSL_accept, [](SSL * /*ssl*/) { return true; },
      [this](SSL *ssl, Stream &strm, bool last_connection,
             bool &connection_close) {
        return process_request(strm, last_connection, connection_close,
                               [&](Request &req) { req.ssl = ssl; });
      });
}